

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer.cc
# Opt level: O3

string * __thiscall
sentencepiece::normalizer::Normalizer::Normalize_abi_cxx11_
          (string *__return_storage_ptr__,Normalizer *this,string_view input)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> norm_to_orig;
  Status local_40;
  void *local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = 0;
  local_38 = (void *)0x0;
  uStack_30 = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  (*this->_vptr_Normalizer[4])(&local_40,this,input._M_len,input._M_str,__return_storage_ptr__);
  util::Status::IgnoreError(&local_40);
  util::Status::~Status(&local_40);
  if (local_38 != (void *)0x0) {
    operator_delete(local_38,local_28 - (long)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Normalizer::Normalize(absl::string_view input) const {
  std::vector<size_t> norm_to_orig;
  std::string normalized;
  Normalize(input, &normalized, &norm_to_orig).IgnoreError();
  return normalized;
}